

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfinityTests.cpp
# Opt level: O3

void __thiscall IsPositiveInfinityTests::~IsPositiveInfinityTests(IsPositiveInfinityTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run() {
		Then("Is::PositiveInfinity(0.0f) is False", []() {
			AssertThat(ut11::Is::PositiveInfinity(0.0f), ut11::Is::False);
		});

		Then("Is::PositiveInfinity(+Infinity) is True", []() {
			AssertThat(ut11::Is::PositiveInfinity(std::numeric_limits<float>::infinity()), ut11::Is::True);
		});

		Then("Is::PositiveInfinity(-Infinity) is False", []() {
			AssertThat(ut11::Is::PositiveInfinity(-std::numeric_limits<float>::infinity()), ut11::Is::False);
		});

		Then("Is::PositiveInfinity is Operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::PositiveInfinity) >::value, ut11::Is::True);
		});

		Then("Is::PositiveInfinity has an error message", []() {
			AssertThat(ut11::Is::PositiveInfinity.GetErrorMessage(0.0f), ut11::Is::Not::EqualTo(""));
		});
	}